

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

void write_int32(bson *b,int32_t v)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  
  iVar1 = b->size;
  iVar4 = iVar1 + 4;
  iVar2 = b->cap;
  if (iVar2 < iVar4) {
    do {
      iVar2 = iVar2 * 2;
    } while (iVar2 <= iVar4);
    b->cap = iVar2;
    if (b->ptr == b->buffer) {
      puVar3 = (uint8_t *)malloc((long)iVar2);
      b->ptr = puVar3;
      memcpy(puVar3,b->buffer,(long)iVar1);
    }
    else {
      puVar3 = (uint8_t *)realloc(b->ptr,(long)iVar2);
      b->ptr = puVar3;
    }
  }
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)v;
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 8);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x10);
  iVar1 = b->size;
  b->size = iVar1 + 1;
  b->ptr[iVar1] = (uint8_t)((uint)v >> 0x18);
  return;
}

Assistant:

static inline void
write_int32(struct bson *b, int32_t v) {
	uint32_t uv = (uint32_t)v;
	bson_reserve(b,4);
	b->ptr[b->size++] = uv & 0xff;
	b->ptr[b->size++] = (uv >> 8)&0xff;
	b->ptr[b->size++] = (uv >> 16)&0xff;
	b->ptr[b->size++] = (uv >> 24)&0xff;
}